

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainUtils.c
# Opt level: O0

char * Abc_UtilsGetUsersInput(Abc_Frame_t *pAbc)

{
  Abc_Frame_t *pAbc_local;
  
  sprintf(Abc_UtilsGetUsersInput::Prompt,"abc %02d> ",(ulong)(uint)pAbc->nSteps);
  if ((Abc_UtilsGetUsersInput::line != (char *)0x0) && (Abc_UtilsGetUsersInput::line != (char *)0x0)
     ) {
    free(Abc_UtilsGetUsersInput::line);
    Abc_UtilsGetUsersInput::line = (char *)0x0;
  }
  Abc_UtilsGetUsersInput::line = (char *)readline(Abc_UtilsGetUsersInput::Prompt);
  if (Abc_UtilsGetUsersInput::line != (char *)0x0) {
    add_history(Abc_UtilsGetUsersInput::line);
    return Abc_UtilsGetUsersInput::line;
  }
  printf("***EOF***\n");
  exit(0);
}

Assistant:

char * Abc_UtilsGetUsersInput( Abc_Frame_t * pAbc )
{
    static char Prompt[5000];
    sprintf( Prompt, "abc %02d> ", pAbc->nSteps );
#ifdef ABC_USE_READLINE
    {
    static char * line = NULL;
    if (line != NULL) ABC_FREE(line);
    line = readline(Prompt);  
    if (line == NULL){ printf("***EOF***\n"); exit(0); }
    add_history(line);
    return line;
    }
#else
    {
    char * pRetValue;
    fprintf( pAbc->Out, "%s", Prompt );
    pRetValue = fgets( Prompt, 5000, stdin );
    return Prompt;
    }
#endif
}